

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O3

page_collection *
page_collection_lock_x86_64(uc_struct_conflict *uc,tb_page_addr_t start,tb_page_addr_t end)

{
  page_collection *set;
  GTree *pGVar1;
  PageDesc *pPVar2;
  ulong uVar3;
  uintptr_t uVar4;
  ulong index;
  bool bVar5;
  
  set = (page_collection *)g_malloc(0x10);
  if (start >> 0xc <= end >> 0xc) {
    pGVar1 = g_tree_new_full(tb_page_addr_cmp,(gpointer)0x0,(GDestroyNotify)0x0,page_entry_destroy);
    set->tree = pGVar1;
    set->max = (page_entry *)0x0;
    index = start >> 0xc;
    do {
      pPVar2 = page_find_alloc(uc,index,0);
      if (pPVar2 != (PageDesc *)0x0) {
        page_trylock_add(uc,set,index << 0xc);
        for (uVar4 = pPVar2->first_tb; uVar3 = uVar4 & 0xfffffffffffffffe, uVar3 != 0;
            uVar4 = *(ulong *)(uVar3 + 0x38 + (ulong)((uint)uVar4 & 1) * 8)) {
          page_trylock_add(uc,set,*(tb_page_addr_t *)(uVar3 + 0x48));
          if (*(tb_page_addr_t *)(uVar3 + 0x50) != 0xffffffffffffffff) {
            page_trylock_add(uc,set,*(tb_page_addr_t *)(uVar3 + 0x50));
          }
        }
      }
      bVar5 = index != end >> 0xc;
      index = index + 1;
    } while (bVar5);
    return set;
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
             ,0x293,"start <= end");
}

Assistant:

struct page_collection *
page_collection_lock(struct uc_struct *uc, tb_page_addr_t start, tb_page_addr_t end)
{
    struct page_collection *set = g_malloc(sizeof(*set));
    tb_page_addr_t index;
    PageDesc *pd;

    start >>= TARGET_PAGE_BITS;
    end   >>= TARGET_PAGE_BITS;
    g_assert(start <= end);

    set->tree = g_tree_new_full(tb_page_addr_cmp, NULL, NULL,
                                page_entry_destroy);
    set->max = NULL;
    assert_no_pages_locked();

 retry:
#if 0
    g_tree_foreach(set->tree, page_entry_lock, NULL);
#endif

    for (index = start; index <= end; index++) {
        TranslationBlock *tb;
        int n;

        pd = page_find(uc, index);
        if (pd == NULL) {
            continue;
        }
        if (page_trylock_add(uc, set, index << TARGET_PAGE_BITS)) {
#if 0
            g_tree_foreach(set->tree, page_entry_unlock, NULL);
#endif
            goto retry;
        }
        assert_page_locked(pd);
        PAGE_FOR_EACH_TB(pd, tb, n) {
            if (page_trylock_add(uc, set, tb->page_addr[0]) ||
                (tb->page_addr[1] != -1 &&
                 page_trylock_add(uc, set, tb->page_addr[1]))) {
                /* drop all locks, and reacquire in order */
#if 0
                g_tree_foreach(set->tree, page_entry_unlock, NULL);
#endif
                goto retry;
            }
        }
    }
    return set;
}